

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O1

void __thiscall TEST_MockCallTest_clear_Test::testBody(TEST_MockCallTest_clear_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString SStack_38;
  SimpleString local_28;
  
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"func");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_28);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x27])(pMVar2);
  SimpleString::~SimpleString(&SStack_38);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  iVar1 = (*pMVar2->_vptr_MockSupport[0x26])(pMVar2);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(byte)((byte)iVar1 ^ 1),"CHECK","! mock().expectedCallsLeft()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x2d,pTVar4);
  SimpleString::~SimpleString(&SStack_38);
  return;
}

Assistant:

TEST(MockCallTest, clear)
{
    mock().expectOneCall("func");
    mock().clear();
    CHECK(! mock().expectedCallsLeft());
}